

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFieldToObject
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  FieldDescriptor *pFVar1;
  Printer *this_00;
  bool bVar2;
  CppType CVar3;
  Type TVar4;
  Syntax SVar5;
  GeneratorOptions *options_00;
  FileDescriptor *this_01;
  string *__return_storage_ptr__;
  FieldDescriptor *pFVar6;
  undefined1 in_R9B;
  bool local_181;
  undefined1 local_180 [7];
  bool use_default;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string value_to_object;
  FieldDescriptor *value_field;
  string local_48;
  GeneratorOptions *local_28;
  FieldDescriptor *field_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  __return_storage_ptr__ = &local_48;
  local_28 = (GeneratorOptions *)field;
  field_local = (FieldDescriptor *)printer;
  printer_local = (Printer *)options;
  options_local = (GeneratorOptions *)this;
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,field
            );
  io::Printer::Print(printer,"$fieldname$: ","fieldname",__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_48);
  bVar2 = anon_unknown_0::IsMap((GeneratorOptions *)printer_local,(FieldDescriptor *)local_28);
  if (bVar2) {
    value_to_object.field_2._8_8_ = anon_unknown_0::MapFieldValue((FieldDescriptor *)local_28);
    std::__cxx11::string::string((string *)local_80);
    CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)value_to_object.field_2._8_8_);
    this_00 = printer_local;
    if (CVar3 == CPPTYPE_MESSAGE) {
      options_00 = (GeneratorOptions *)
                   FieldDescriptor::message_type((FieldDescriptor *)value_to_object.field_2._8_8_);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&local_c0,(_anonymous_namespace_ *)this_00,options_00,
                 (Descriptor *)__return_storage_ptr__);
      std::operator+(&local_a0,&local_c0,".toObject");
      std::__cxx11::string::operator=((string *)local_80,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    else {
      std::__cxx11::string::operator=((string *)local_80,"undefined");
    }
    pFVar1 = field_local;
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&local_e0,(_anonymous_namespace_ *)printer_local,local_28,(FieldDescriptor *)0x0,
               BYTES_DEFAULT,(bool)in_R9B);
    io::Printer::Print((Printer *)pFVar1,
                       "(f = msg.get$name$()) ? f.toObject(includeInstance, $valuetoobject$) : []",
                       "name",&local_e0,"valuetoobject",(string *)local_80);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)local_80);
  }
  else {
    CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)local_28);
    if (CVar3 == CPPTYPE_MESSAGE) {
      bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)local_28);
      pFVar1 = field_local;
      if (bVar2) {
        pFVar6 = (FieldDescriptor *)0x0;
        (anonymous_namespace)::JSGetterName_abi_cxx11_
                  (&local_100,(_anonymous_namespace_ *)printer_local,local_28,(FieldDescriptor *)0x0
                   ,BYTES_DEFAULT,(bool)in_R9B);
        (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                  (&local_120,(_anonymous_namespace_ *)printer_local,local_28,pFVar6);
        io::Printer::Print((Printer *)pFVar1,
                           "jspb.Message.toObjectList(msg.get$getter$(),\n    $type$.toObject, includeInstance)"
                           ,"getter",&local_100,"type",&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_100);
      }
      else {
        pFVar6 = (FieldDescriptor *)0x0;
        (anonymous_namespace)::JSGetterName_abi_cxx11_
                  (&local_140,(_anonymous_namespace_ *)printer_local,local_28,(FieldDescriptor *)0x0
                   ,BYTES_DEFAULT,(bool)in_R9B);
        (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                  (&local_160,(_anonymous_namespace_ *)printer_local,local_28,pFVar6);
        io::Printer::Print((Printer *)pFVar1,
                           "(f = msg.get$getter$()) && $type$.toObject(includeInstance, f)","getter"
                           ,&local_140,"type",&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_140);
      }
    }
    else {
      TVar4 = FieldDescriptor::type((FieldDescriptor *)local_28);
      pFVar1 = field_local;
      if (TVar4 == TYPE_BYTES) {
        (anonymous_namespace)::JSGetterName_abi_cxx11_
                  ((string *)local_180,(_anonymous_namespace_ *)printer_local,local_28,
                   (FieldDescriptor *)0x1,BYTES_DEFAULT,(bool)in_R9B);
        io::Printer::Print((Printer *)pFVar1,"msg.get$getter$()","getter",(string *)local_180);
        std::__cxx11::string::~string((string *)local_180);
      }
      else {
        local_181 = FieldDescriptor::has_default_value((FieldDescriptor *)local_28);
        this_01 = FieldDescriptor::file((FieldDescriptor *)local_28);
        SVar5 = FileDescriptor::syntax(this_01);
        if (((SVar5 == SYNTAX_PROTO3) &&
            (bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)local_28), !bVar2)) &&
           (bVar2 = anon_unknown_0::UseBrokenPresenceSemantics
                              ((GeneratorOptions *)printer_local,(FieldDescriptor *)local_28),
           !bVar2)) {
          local_181 = true;
        }
        GenerateFieldValueExpression
                  (this,(Printer *)field_local,"msg",(FieldDescriptor *)local_28,local_181);
      }
    }
  }
  return;
}

Assistant:

void Generator::GenerateClassFieldToObject(const GeneratorOptions& options,
                                           io::Printer* printer,
                                           const FieldDescriptor* field) const {
  printer->Print("$fieldname$: ",
                 "fieldname", JSObjectFieldName(options, field));

  if (IsMap(options, field)) {
    const FieldDescriptor* value_field = MapFieldValue(field);
    // If the map values are of a message type, we must provide their static
    // toObject() method; otherwise we pass undefined for that argument.
    string value_to_object;
    if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      value_to_object =
          GetMessagePath(options, value_field->message_type()) + ".toObject";
    } else {
      value_to_object = "undefined";
    }
    printer->Print(
        "(f = msg.get$name$()) ? f.toObject(includeInstance, $valuetoobject$) "
        ": []",
        "name", JSGetterName(options, field), "valuetoobject", value_to_object);
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    // Message field.
    if (field->is_repeated()) {
      {
        printer->Print("jspb.Message.toObjectList(msg.get$getter$(),\n"
                       "    $type$.toObject, includeInstance)",
                       "getter", JSGetterName(options, field),
                       "type", SubmessageTypeRef(options, field));
      }
    } else {
      printer->Print("(f = msg.get$getter$()) && "
                     "$type$.toObject(includeInstance, f)",
                     "getter", JSGetterName(options, field),
                     "type", SubmessageTypeRef(options, field));
    }
  } else if (field->type() == FieldDescriptor::TYPE_BYTES) {
    // For bytes fields we want to always return the B64 data.
    printer->Print("msg.get$getter$()",
                   "getter", JSGetterName(options, field, BYTES_B64));
  } else {
    bool use_default = field->has_default_value();

    if (field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3 &&
        // Repeated fields get initialized to their default in the constructor
        // (why?), so we emit a plain getField() call for them.
        !field->is_repeated() && !UseBrokenPresenceSemantics(options, field)) {
      // Proto3 puts all defaults (including implicit defaults) in toObject().
      // But for proto2 we leave the existing semantics unchanged: unset fields
      // without default are unset.
      use_default = true;
    }

    // We don't implement this by calling the accessors, because the semantics
    // of the accessors are changing independently of the toObject() semantics.
    // We are migrating the accessors to return defaults instead of null, but
    // it may take longer to migrate toObject (or we might not want to do it at
    // all).  So we want to generate independent code.
    GenerateFieldValueExpression(printer, "msg", field, use_default);
  }
}